

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

uint dxil_spv::get_geometry_shader_stream_index(MDNode *node)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  MDOperand *pMVar4;
  MDNode *this;
  uint local_28;
  uint i;
  uint num_pairs;
  MDNode *attr;
  MDNode *node_local;
  
  uVar2 = LLVMBC::MDNode::getNumOperands(node);
  if (10 < uVar2) {
    pMVar4 = LLVMBC::MDNode::getOperand(node,10);
    bVar1 = LLVMBC::MDOperand::operator_cast_to_bool(pMVar4);
    if (bVar1) {
      pMVar4 = LLVMBC::MDNode::getOperand(node,10);
      this = LLVMBC::dyn_cast<LLVMBC::MDNode>(pMVar4);
      if (this == (MDNode *)0x0) {
        return 0;
      }
      uVar2 = LLVMBC::MDNode::getNumOperands(this);
      for (local_28 = 0; local_28 < uVar2 >> 1; local_28 = local_28 + 1) {
        uVar3 = get_constant_metadata<unsigned_int>(this,local_28 << 1);
        if (uVar3 == 0) {
          uVar2 = get_constant_metadata<unsigned_int>(this,local_28 * 2 + 1);
          return uVar2;
        }
      }
    }
  }
  return 0;
}

Assistant:

static unsigned get_geometry_shader_stream_index(const llvm::MDNode *node)
{
	if (node->getNumOperands() >= 11 && node->getOperand(10))
	{
		auto *attr = llvm::dyn_cast<llvm::MDNode>(node->getOperand(10));
		if (!attr)
			return 0;

		unsigned num_pairs = attr->getNumOperands() / 2;
		for (unsigned i = 0; i < num_pairs; i++)
		{
			if (static_cast<DXIL::GSStageOutTags>(get_constant_metadata(attr, 2 * i + 0)) == DXIL::GSStageOutTags::Stream)
				return get_constant_metadata(attr, 2 * i + 1);
		}
	}
	return 0;
}